

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *other)

{
  undefined8 *puVar1;
  ulong nbCols;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  Index innerSize;
  undefined8 *puVar8;
  Index outerSize;
  undefined8 uVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  Index col;
  long lVar13;
  Index inner;
  long lVar14;
  Index row;
  long lVar15;
  ulong uVar16;
  
  uVar16 = *(ulong *)(other + 8);
  nbCols = *(ulong *)(other + 0x10);
  bVar10 = nbCols == 0 || uVar16 == 0;
  if ((bVar10) ||
     (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar9 = SUB168(auVar7 % SEXT816((long)nbCols),0),
     (long)uVar16 <= SUB168(auVar7 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | uVar16) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar10) ||
       (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar9 = SUB168(auVar7 % SEXT816((long)nbCols),0),
       (long)uVar16 <= SUB168(auVar7 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar16,uVar16,nbCols);
      lVar2 = *(long *)(this + 8);
      if ((lVar2 == *(long *)(other + 8)) &&
         (lVar3 = *(long *)(this + 0x10), lVar3 == *(long *)(other + 0x10))) {
        if (0 < lVar3) {
          lVar11 = 0;
          lVar12 = 0;
          lVar13 = 0;
          do {
            if (0 < lVar12) {
              *(undefined8 *)(*(long *)this + *(long *)(this + 8) * lVar13 * 8) =
                   *(undefined8 *)(*(long *)other + *(long *)(other + 0x20) * lVar13 * 8);
            }
            uVar16 = lVar2 - lVar12 & 0xfffffffffffffffe;
            lVar14 = uVar16 + lVar12;
            lVar15 = lVar12;
            if (0 < (long)uVar16) {
              do {
                puVar8 = (undefined8 *)
                         (*(long *)(other + 0x20) * lVar11 + *(long *)other + lVar15 * 8);
                uVar9 = puVar8[1];
                puVar1 = (undefined8 *)(*(long *)(this + 8) * lVar11 + *(long *)this + lVar15 * 8);
                *puVar1 = *puVar8;
                puVar1[1] = uVar9;
                lVar15 = lVar15 + 2;
              } while (lVar15 < lVar14);
            }
            if (lVar14 < lVar2) {
              lVar15 = *(long *)(this + 8);
              lVar4 = *(long *)this;
              lVar5 = *(long *)(other + 0x20);
              lVar6 = *(long *)other;
              do {
                *(undefined8 *)(lVar15 * lVar11 + lVar4 + lVar14 * 8) =
                     *(undefined8 *)(lVar5 * lVar11 + lVar6 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while (lVar14 < lVar2);
            }
            lVar12 = (long)(lVar12 + (ulong)((uint)lVar2 & 1)) % 2;
            if (lVar2 < lVar12) {
              lVar12 = lVar2;
            }
            lVar13 = lVar13 + 1;
            lVar11 = lVar11 + 8;
          } while (lVar13 != lVar3);
        }
        return (Matrix<double,__1,__1,_0,__1,__1> *)this;
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8,bVar10,uVar9);
  *puVar8 = operator_delete;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }